

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t canSymlink(void)

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  void *in_stack_00000018;
  wchar_t in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  wchar_t in_stack_00000034;
  char *in_stack_00000038;
  char *in_stack_000001c0;
  char *in_stack_000001c8;
  wchar_t in_stack_000001d4;
  char *in_stack_000001d8;
  wchar_t local_4;
  
  if (canSymlink::tested == L'\0') {
    canSymlink::tested = L'\x01';
    assertion_make_file(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                        in_stack_00000020,in_stack_00000018);
    iVar1 = symlink("canSymlink.0","canSymlink.1");
    bVar3 = false;
    if (iVar1 == 0) {
      wVar2 = is_symlink(in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,in_stack_000001c0);
      bVar3 = wVar2 != L'\0';
    }
    local_4 = (wchar_t)bVar3;
  }
  else {
    local_4 = canSymlink::value;
  }
  canSymlink::value = local_4;
  return local_4;
}

Assistant:

int
canSymlink(void)
{
	/* Remember the test result */
	static int value = 0, tested = 0;
	if (tested)
		return (value);

	++tested;
	assertion_make_file(__FILE__, __LINE__, "canSymlink.0", 0644, 1, "a");
	/* Note: Cygwin has its own symlink() emulation that does not
	 * use the Win32 CreateSymbolicLink() function. */
#if defined(_WIN32) && !defined(__CYGWIN__)
	value = my_CreateSymbolicLinkA("canSymlink.1", "canSymlink.0", 0)
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1", "canSymlink.0");
#elif HAVE_SYMLINK
	value = (0 == symlink("canSymlink.0", "canSymlink.1"))
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1","canSymlink.0");
#endif
	return (value);
}